

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastDecimalToNumeric<int,duckdb::hugeint_t>
               (int input,hugeint_t *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  string *msg;
  undefined7 in_register_00000009;
  PhysicalType params_1;
  long lVar2;
  allocator local_59;
  Exception local_58 [2];
  string error;
  
  lVar2 = (long)input;
  msg = (string *)
        (((long)((-(ulong)((uint)input >> 0x1f) ^
                 *(ulong *)(NumericHelper::POWERS_OF_TEN +
                           (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8)) +
                (ulong)((uint)input >> 0x1f)) / 2 + lVar2) /
        (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                        (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8));
  bVar1 = Hugeint::TryConvert<int>((int32_t)msg,result);
  params_1 = (PhysicalType)lVar2;
  if (!bVar1) {
    ::std::__cxx11::string::string
              ((string *)local_58,"Failed to cast decimal value %d to type %s",&local_59);
    Exception::ConstructMessage<long,duckdb::PhysicalType>(&error,local_58,msg,0xcc,params_1);
    ::std::__cxx11::string::~string((string *)local_58);
    HandleCastError::AssignError(&error,parameters);
    ::std::__cxx11::string::~string((string *)&error);
  }
  return bVar1;
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}